

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<long_double>_> *this)

{
  char cVar1;
  TPZMatrix<std::complex<long_double>_> *pTVar2;
  int iVar3;
  int extraout_var;
  long lVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  complex<long_double> __r;
  complex<long_double> tmp2;
  complex<long_double> tmp;
  undefined4 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  undefined2 uVar14;
  unkbyte10 Var15;
  complex<long_double> local_128;
  TPZMatrix<std::complex<long_double>_> *local_108;
  long local_100;
  complex<long_double> local_f8;
  longdouble local_d0;
  longdouble local_c4;
  complex<long_double> local_b8;
  undefined4 local_98 [10];
  long local_70;
  longdouble local_64;
  unkbyte10 local_58;
  longdouble local_48;
  
  cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar1 != '\0') && (cVar1 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    local_108 = this;
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_100 = CONCAT44(extraout_var,iVar3);
    if (local_100 != 0 && -1 < extraout_var) {
      local_64 = (longdouble)1e-16;
      lVar5 = 0;
      do {
        pTVar2 = local_108;
        lVar8 = in_ST0;
        lVar9 = in_ST1;
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        if (lVar5 != 0) {
          lVar6 = 0;
          do {
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_98,pTVar2,lVar5,lVar6);
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_b8,pTVar2,lVar5,lVar6);
            lVar7 = -(longdouble)
                     CONCAT28(local_b8._M_value._24_2_,
                              CONCAT44(local_b8._M_value._20_4_,local_b8._M_value._16_4_));
            local_f8._M_value._0_4_ = local_b8._M_value._0_4_;
            local_f8._M_value._4_4_ = local_b8._M_value._4_4_;
            local_f8._M_value._8_2_ = local_b8._M_value._8_2_;
            local_f8._M_value._16_4_ = SUB104(lVar7,0);
            local_f8._M_value._20_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
            local_f8._M_value._24_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
            local_128._M_value._0_4_ = local_98[0];
            local_128._M_value._4_4_ = local_98[1];
            local_128._M_value._8_2_ = (undefined2)local_98[2];
            local_128._M_value._16_4_ = local_98[4];
            local_128._M_value._20_4_ = local_98[5];
            local_128._M_value._24_2_ = (undefined2)local_98[6];
            std::complex<long_double>::operator*=(&local_128,&local_f8);
            local_d0 = (longdouble)
                       CONCAT28(local_128._M_value._8_2_,
                                CONCAT44(local_128._M_value._4_4_,local_128._M_value._0_4_)) +
                       (longdouble)0;
            local_c4 = (longdouble)
                       CONCAT28(local_128._M_value._24_2_,
                                CONCAT44(local_128._M_value._20_4_,local_128._M_value._16_4_)) +
                       (longdouble)0;
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_98,pTVar2,lVar5,lVar5);
            local_128._M_value._12_4_ = local_98[3];
            local_128._M_value._28_4_ = local_98[7];
            lVar7 = (longdouble)CONCAT28((undefined2)local_98[2],CONCAT44(local_98[1],local_98[0]))
                    - local_d0;
            lVar10 = (longdouble)CONCAT28((undefined2)local_98[6],CONCAT44(local_98[5],local_98[4]))
                     - local_c4;
            local_128._M_value._0_4_ = SUB104(lVar7,0);
            local_128._M_value._4_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
            local_128._M_value._8_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
            local_128._M_value._16_4_ = SUB104(lVar10,0);
            local_128._M_value._20_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
            local_128._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
            in_ST5 = in_ST4;
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (pTVar2,lVar5,lVar5,&local_128);
            lVar6 = lVar6 + 1;
            in_ST0 = in_ST2;
            in_ST1 = in_ST3;
          } while (lVar5 != lVar6);
        }
        in_ST3 = in_ST5;
        in_ST2 = in_ST4;
        (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_f8,pTVar2,lVar5,lVar5);
        local_128._M_value._0_4_ = local_f8._M_value._0_4_;
        local_128._M_value._4_4_ = local_f8._M_value._4_4_;
        local_128._M_value._8_2_ = local_f8._M_value._8_2_;
        local_128._M_value._16_4_ = local_f8._M_value._16_4_;
        local_128._M_value._20_4_ = local_f8._M_value._20_4_;
        local_128._M_value._24_2_ = local_f8._M_value._24_2_;
        in_ST4 = in_ST3;
        in_ST5 = in_ST3;
        uVar11 = local_f8._M_value._0_4_;
        uVar12 = local_f8._M_value._8_2_;
        uVar13 = local_f8._M_value._16_4_;
        uVar14 = local_f8._M_value._24_2_;
        csqrtl();
        local_98[0] = SUB104(lVar8,0);
        local_98[1] = (undefined4)((unkuint10)lVar8 >> 0x20);
        local_98[2]._0_2_ = (undefined2)((unkuint10)lVar8 >> 0x40);
        local_98[4] = SUB104(lVar9,0);
        local_98[5] = (undefined4)((unkuint10)lVar9 >> 0x20);
        local_98[6]._0_2_ = (undefined2)((unkuint10)lVar9 >> 0x40);
        (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (pTVar2,lVar5,lVar5,local_98,in_R8,in_R9,uVar11,uVar12,uVar13,uVar14);
        lVar6 = lVar5 + 1;
        local_70 = lVar6;
        if (lVar6 < local_100) {
          do {
            pTVar2 = local_108;
            lVar8 = in_ST1;
            lVar9 = in_ST2;
            if (lVar5 != 0) {
              lVar4 = 0;
              do {
                (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_f8,pTVar2,lVar5,lVar4);
                (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_58,pTVar2,lVar6,lVar4);
                lVar7 = -local_48;
                local_b8._M_value._0_4_ = SUB104(local_58,0);
                local_b8._M_value._4_4_ = SUB104((unkuint10)local_58 >> 0x20,0);
                local_b8._M_value._8_2_ = SUB102((unkuint10)local_58 >> 0x40,0);
                local_b8._M_value._16_4_ = SUB104(lVar7,0);
                local_b8._M_value._20_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
                local_b8._M_value._24_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
                local_128._M_value._0_4_ = local_f8._M_value._0_4_;
                local_128._M_value._4_4_ = local_f8._M_value._4_4_;
                local_128._M_value._8_2_ = local_f8._M_value._8_2_;
                local_128._M_value._16_4_ = local_f8._M_value._16_4_;
                local_128._M_value._20_4_ = local_f8._M_value._20_4_;
                local_128._M_value._24_2_ = local_f8._M_value._24_2_;
                std::complex<long_double>::operator*=(&local_128,&local_b8);
                local_d0 = (longdouble)
                           CONCAT28(local_128._M_value._8_2_,
                                    CONCAT44(local_128._M_value._4_4_,local_128._M_value._0_4_)) +
                           (longdouble)0;
                local_c4 = (longdouble)
                           CONCAT28(local_128._M_value._24_2_,
                                    CONCAT44(local_128._M_value._20_4_,local_128._M_value._16_4_)) +
                           (longdouble)0;
                (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_f8,pTVar2,lVar5,lVar6);
                local_128._M_value._12_4_ = local_f8._M_value._12_4_;
                local_128._M_value._28_4_ = local_f8._M_value._28_4_;
                lVar7 = (longdouble)
                        CONCAT28(local_f8._M_value._8_2_,
                                 CONCAT44(local_f8._M_value._4_4_,local_f8._M_value._0_4_)) -
                        local_d0;
                lVar10 = (longdouble)
                         CONCAT28(local_f8._M_value._24_2_,
                                  CONCAT44(local_f8._M_value._20_4_,local_f8._M_value._16_4_)) -
                         local_c4;
                local_128._M_value._0_4_ = SUB104(lVar7,0);
                local_128._M_value._4_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
                local_128._M_value._8_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
                local_128._M_value._16_4_ = SUB104(lVar10,0);
                local_128._M_value._20_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
                local_128._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
                (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (pTVar2,lVar5,lVar6,&local_128);
                lVar4 = lVar4 + 1;
              } while (lVar5 != lVar4);
            }
            in_ST1 = in_ST4;
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_f8,pTVar2,lVar5,lVar5);
            local_128._M_value._0_4_ = local_f8._M_value._0_4_;
            local_128._M_value._4_4_ = local_f8._M_value._4_4_;
            local_128._M_value._8_2_ = local_f8._M_value._8_2_;
            local_128._M_value._16_4_ = local_f8._M_value._16_4_;
            local_128._M_value._20_4_ = local_f8._M_value._20_4_;
            local_128._M_value._24_2_ = local_f8._M_value._24_2_;
            uVar11 = local_f8._M_value._0_4_;
            uVar12 = local_f8._M_value._8_2_;
            uVar13 = local_f8._M_value._16_4_;
            uVar14 = local_f8._M_value._24_2_;
            cabsl();
            lVar7 = ABS(in_ST0);
            in_ST0 = in_ST3;
            if (lVar7 < local_64) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
              in_ST0 = in_ST3;
            }
            pTVar2 = local_108;
            (*(local_108->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_b8,local_108,lVar5,lVar6,in_R8,in_R9,uVar11,uVar12,uVar13,uVar14);
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_58,pTVar2,lVar5,lVar5);
            local_128._M_value._0_4_ = local_b8._M_value._0_4_;
            local_128._M_value._4_4_ = local_b8._M_value._4_4_;
            local_128._M_value._8_2_ = local_b8._M_value._8_2_;
            local_128._M_value._12_4_ = local_b8._M_value._12_4_;
            local_128._M_value._16_4_ = local_b8._M_value._16_4_;
            local_128._M_value._20_4_ = local_b8._M_value._20_4_;
            local_128._M_value._24_2_ = local_b8._M_value._24_2_;
            local_128._M_value._28_4_ = local_b8._M_value._28_4_;
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            in_ST4 = in_ST1;
            in_ST5 = in_ST1;
            uVar11 = local_b8._M_value._0_4_;
            uVar12 = local_b8._M_value._8_2_;
            uVar13 = local_b8._M_value._16_4_;
            uVar14 = local_b8._M_value._24_2_;
            Var15 = local_58;
            lVar7 = local_48;
            __divxc3();
            local_128._M_value._0_4_ = SUB104(lVar8,0);
            local_128._M_value._4_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
            local_128._M_value._8_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
            local_128._M_value._16_4_ = SUB104(lVar9,0);
            local_128._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
            local_128._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (pTVar2,lVar5,lVar6,&local_128,in_R8,in_R9,uVar11,uVar12,uVar13,uVar14,Var15,
                       lVar7);
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_b8,pTVar2,lVar5,lVar6);
            lVar8 = -(longdouble)
                     CONCAT28(local_b8._M_value._24_2_,
                              CONCAT44(local_b8._M_value._20_4_,local_b8._M_value._16_4_));
            local_128._M_value._0_4_ = local_b8._M_value._0_4_;
            local_128._M_value._4_4_ = local_b8._M_value._4_4_;
            local_128._M_value._8_2_ = local_b8._M_value._8_2_;
            local_128._M_value._16_4_ = SUB104(lVar8,0);
            local_128._M_value._20_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
            local_128._M_value._24_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
            (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (pTVar2,lVar6,lVar5,&local_128);
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_100);
        }
        lVar5 = local_70;
      } while (local_70 != local_100);
    }
    (local_108->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}